

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_unicode_sets.cpp
# Opt level: O2

UnicodeSet * icu_63::unisets::get(Key key)

{
  uint in_EAX;
  UnicodeSet *pUVar1;
  UErrorCode localStatus;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  umtx_initOnce((UInitOnce *)&::(anonymous_namespace)::gNumberParseUniSetsInitOnce,
                anon_unknown.dwarf_281b1d::initNumberParseUniSets,
                (UErrorCode *)((long)&uStack_18 + 4));
  if (uStack_18._4_4_ < 1) {
    pUVar1 = (UnicodeSet *)::(anonymous_namespace)::gEmptyUnicodeSet;
    if ((UnicodeSet *)(&::(anonymous_namespace)::gUnicodeSets)[key] != (UnicodeSet *)0x0) {
      pUVar1 = (UnicodeSet *)(&::(anonymous_namespace)::gUnicodeSets)[key];
    }
  }
  else {
    pUVar1 = (UnicodeSet *)::(anonymous_namespace)::gEmptyUnicodeSet;
  }
  return pUVar1;
}

Assistant:

const UnicodeSet* unisets::get(Key key) {
    UErrorCode localStatus = U_ZERO_ERROR;
    umtx_initOnce(gNumberParseUniSetsInitOnce, &initNumberParseUniSets, localStatus);
    if (U_FAILURE(localStatus)) {
        return reinterpret_cast<UnicodeSet*>(gEmptyUnicodeSet);
    }
    return getImpl(key);
}